

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O2

void __thiscall
skiplist<DictKey,_std::less<DictKey>_>::_setup_random_number_generator
          (skiplist<DictKey,_std::less<DictKey>_> *this)

{
  uint uVar1;
  mt19937_64 mt;
  random_device rd;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_1d60;
  random_device local_1398;
  
  std::random_device::random_device(&local_1398);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&local_1d60,(ulong)uVar1);
  memcpy(&this->mt_,&local_1d60,0x9c8);
  *(undefined4 *)&(this->dist_)._M_param._M_a = 0;
  *(undefined4 *)((long)&(this->dist_)._M_param._M_a + 4) = 0;
  *(undefined4 *)&(this->dist_)._M_param._M_b = 0;
  *(undefined4 *)((long)&(this->dist_)._M_param._M_b + 4) = 0x3ff00000;
  std::random_device::~random_device(&local_1398);
  return;
}

Assistant:

void _setup_random_number_generator() {
        // set up random number generator
        // ref: https://stackoverflow.com/a/19666713/11199009
        std::random_device rd;
        // ref: https://www.cplusplus.com/reference/random/mt19937_64/
        std::mt19937_64 mt(rd());
        // usage of this is: dist(mt)
        std::uniform_real_distribution<double> dist(0.0, 1.0);

        this->mt_ = mt;
        this->dist_ = dist;
    }